

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O2

bool doctest::operator<(double lhs,Approx *rhs)

{
  bool bVar1;
  
  if (rhs->m_value <= lhs) {
    return false;
  }
  bVar1 = operator==(lhs,rhs);
  return !bVar1;
}

Assistant:

bool operator<(double lhs, const Approx& rhs) { return lhs < rhs.m_value && lhs != rhs; }